

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall Chainstate::LoadGenesisBlock(Chainstate *this)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  CChainParams *pCVar3;
  BlockManager *this_00;
  CBlock *block_00;
  ConstevalFormatString<1U> fmt;
  char *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  char (*in_stack_00000050) [17];
  runtime_error *e;
  CBlockIndex *pindex;
  CBlock *block;
  CChainParams *params;
  CBlockIndex *in_stack_00000100;
  FlatFilePos blockPos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  key_type *in_stack_fffffffffffffea0;
  unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
  *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  CBlockHeader *in_stack_fffffffffffffed0;
  BlockManager *in_stack_fffffffffffffed8;
  int source_line;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54 [12];
  char *pcVar4;
  bool local_89;
  FlatFilePos *in_stack_ffffffffffffffd8;
  CBlock *in_stack_ffffffffffffffe0;
  ChainstateManager *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed0,
             (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
  pCVar3 = ChainstateManager::GetParams
                     ((ChainstateManager *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  this_00 = (BlockManager *)(*(long *)(in_RDI + 0x48) + 0x1e0);
  CChainParams::GenesisBlock
            ((CChainParams *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  CBlockHeader::GetHash
            ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  block_00 = (CBlock *)
             std::
             unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             ::count(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (block_00 == (CBlock *)0x0) {
    fmt.fmt = (char *)CChainParams::GenesisBlock
                                ((CChainParams *)
                                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    ::node::BlockManager::SaveBlockToDisk(this_00,block_00,(int)((ulong)fmt.fmt >> 0x20));
    source_line = (int)((ulong)this_00 >> 0x20);
    bVar2 = FlatFilePos::IsNull((FlatFilePos *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffe98 = 4;
      logging_function._M_str = pcVar4;
      logging_function._M_len = (size_t)pCVar3;
      source_file._4_12_ = in_stack_ffffffffffffff54;
      source_file._M_len._0_4_ = in_stack_ffffffffffffff50;
      LogPrintFormatInternal<char[17]>
                (logging_function,source_file,source_line,(LogFlags)block_00,in_stack_00000040,fmt,
                 in_stack_00000050);
      local_89 = false;
    }
    else {
      ::node::BlockManager::AddToBlockIndex
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 (CBlockIndex **)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      ChainstateManager::ReceivedBlockTransactions
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_00000100,
                 in_stack_ffffffffffffffd8);
      local_89 = true;
    }
  }
  else {
    local_89 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::LoadGenesisBlock()
{
    LOCK(cs_main);

    const CChainParams& params{m_chainman.GetParams()};

    // Check whether we're already initialized by checking for genesis in
    // m_blockman.m_block_index. Note that we can't use m_chain here, since it is
    // set based on the coins db, not the block index db, which is the only
    // thing loaded at this point.
    if (m_blockman.m_block_index.count(params.GenesisBlock().GetHash()))
        return true;

    try {
        const CBlock& block = params.GenesisBlock();
        FlatFilePos blockPos{m_blockman.SaveBlockToDisk(block, 0)};
        if (blockPos.IsNull()) {
            LogError("%s: writing genesis block to disk failed\n", __func__);
            return false;
        }
        CBlockIndex* pindex = m_blockman.AddToBlockIndex(block, m_chainman.m_best_header);
        m_chainman.ReceivedBlockTransactions(block, pindex, blockPos);
    } catch (const std::runtime_error& e) {
        LogError("%s: failed to write genesis block: %s\n", __func__, e.what());
        return false;
    }

    return true;
}